

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall testing::FormatCxxExceptionMessage(testing *this,char *description,char *location)

{
  Message *pMVar1;
  size_t extraout_RDX;
  String SVar2;
  char *local_30;
  char *description_local;
  char *location_local;
  Message message;
  
  local_30 = description;
  description_local = location;
  Message::Message((Message *)&location_local);
  if (description == (char *)0x0) {
    Message::operator<<((Message *)&location_local,(char (*) [22])"Unknown C++ exception");
  }
  else {
    pMVar1 = Message::operator<<((Message *)&location_local,
                                 (char (*) [33])"C++ exception with description \"");
    pMVar1 = Message::operator<<(pMVar1,&local_30);
    Message::operator<<(pMVar1,(char (*) [2])0x137b45);
  }
  pMVar1 = Message::operator<<((Message *)&location_local,(char (*) [12])" thrown in ");
  pMVar1 = Message::operator<<(pMVar1,&description_local);
  Message::operator<<(pMVar1,(char (*) [2])0x13797d);
  internal::StringStreamToString((internal *)this,(stringstream *)location_local);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&location_local);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

static internal::String FormatCxxExceptionMessage(const char* description,
                                                  const char* location) {
  Message message;
  if (description != NULL) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}